

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O2

uint RDL_edgeId(RDL_graph *gra,uint from,uint to)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)to;
  if (from < to) {
    uVar2 = (ulong)from;
  }
  if (to < from) {
    to = from;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (gra->degree[uVar2] == uVar3) {
      return 0xffffffff;
    }
    uVar1 = uVar3 + 1;
  } while (gra->adjList[uVar2][uVar3][0] != to);
  return gra->adjList[uVar2][uVar3][1];
}

Assistant:

unsigned RDL_edgeId(const RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned j, edge;

  if(from > to) {
    /*swap order to make from < to*/
    edge = to;
    to = from;
    from = edge;
  }

  edge = RDL_INVALID_RESULT;

  for(j=0; j<gra->degree[from]; ++j) {
    if(gra->adjList[from][j][0] == to) {
      edge = gra->adjList[from][j][1];
      break;
    }
  }

  return edge;
}